

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler-ls.h
# Opt level: O3

void __thiscall
wabt::LoadStoreTracking::LoadStore
          (LoadStoreTracking *this,uint64_t offset,Opcode opc,Type type,Address align,Node *addr_exp
          )

{
  short sVar1;
  Enum EVar2;
  Address AVar3;
  Address AVar4;
  undefined8 uVar5;
  bool bVar6;
  size_t sVar7;
  mapped_type *this_00;
  mapped_type *pmVar8;
  long lVar9;
  long extraout_RDX;
  ulong uVar10;
  ulong uVar11;
  char *pcVar12;
  ulong uVar13;
  string name;
  Opcode local_98;
  Opcode local_94;
  Address local_90;
  Address local_88;
  uint64_t local_80;
  undefined1 local_78 [48];
  Address local_48;
  
  local_98.enum_ = opc.enum_;
  local_88 = align;
  local_80 = offset;
  Opcode::GetInfo((Info *)local_78,&local_98);
  local_90 = local_48;
  local_94.enum_ = local_98.enum_;
  if ((type.enum_ & I64) == I64) {
    Opcode::GetInfo((Info *)local_78,&local_94);
    uVar5 = local_78._0_8_;
    sVar7 = strlen((char *)local_78._0_8_);
    if (sVar7 < 2) {
      pcVar12 = "%s: __pos (which is %zu) > __size (which is %zu)";
      std::__throw_out_of_range_fmt
                ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",
                 sVar7 - 2,sVar7);
      if (*(int *)(extraout_RDX + 4) == 0x1a) {
        lVar9 = *(long *)(extraout_RDX + 8);
        if (*(int *)(lVar9 + 0x38) != 0x1a) {
          pcVar12 = 
          "const Derived *wabt::cast(const Base *) [Derived = wabt::VarExpr<wabt::ExprType::LocalTee>, Base = wabt::Expr]"
          ;
          goto LAB_00130816;
        }
      }
      else {
        if (*(int *)(extraout_RDX + 4) != 0x18) {
          *(string **)pcVar12 = (string *)pcVar12 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)pcVar12,"");
          return;
        }
        lVar9 = *(long *)(extraout_RDX + 8);
        if (*(int *)(lVar9 + 0x38) != 0x18) {
          pcVar12 = 
          "const Derived *wabt::cast(const Base *) [Derived = wabt::VarExpr<wabt::ExprType::LocalGet>, Base = wabt::Expr]"
          ;
LAB_00130816:
          __assert_fail("isa<Derived>(base)",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/include/wabt/cast.h"
                        ,0x48,pcVar12);
        }
      }
      if (*(int *)(lVar9 + 0x60) == 1) {
        *(string **)pcVar12 = (string *)pcVar12 + 0x10;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)pcVar12,*(long *)(lVar9 + 0x68),
                   *(long *)(lVar9 + 0x70) + *(long *)(lVar9 + 0x68));
        return;
      }
      __assert_fail("is_name()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/include/wabt/ir.h"
                    ,0x3e,"const std::string &wabt::Var::name() const");
    }
    uVar10 = 0xfffffff9;
    sVar1 = *(short *)(uVar5 + (sVar7 - 2));
    Opcode::GetInfo((Info *)local_78,&local_94);
    if (local_48 == 4) {
      uVar11 = 0xffffffff;
      uVar10 = 7;
    }
    else {
      if (local_48 == 2) {
        uVar13 = 0xffffffff00000000;
        if (sVar1 == 0x755f) {
          uVar10 = 6;
        }
        goto LAB_00130653;
      }
      if (local_48 != 1) goto LAB_0013060e;
      uVar11 = 0xfffffffa;
      uVar10 = 4;
    }
    uVar13 = 0xffffffff00000000;
    if (sVar1 != 0x755f) {
      uVar10 = uVar11;
    }
  }
  else {
LAB_0013060e:
    uVar10 = (ulong)type & 0xffffffff;
    uVar13 = (ulong)type & 0xffffffff00000000;
  }
LAB_00130653:
  AddrExpName_abi_cxx11_((string *)local_78,this,addr_exp);
  if ((char *)local_78._8_8_ != (char *)0x0) {
    this_00 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::LoadStoreTracking::LSVar,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::LoadStoreTracking::LSVar>_>_>
              ::operator[](&this->vars,(key_type *)local_78);
    pmVar8 = std::
             map<unsigned_long,_wabt::LoadStoreTracking::LSAccess,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_wabt::LoadStoreTracking::LSAccess>_>_>
             ::operator[](&this_00->accesses,&local_80);
    AVar4 = local_88;
    AVar3 = local_90;
    if ((pmVar8->byte_size != 0) &&
       (((pmVar8->byte_size != local_90 || ((pmVar8->type).enum_ != (Enum)uVar10)) ||
        (pmVar8->align != local_88)))) {
      pmVar8->is_uniform = false;
    }
    bVar6 = Opcode::IsNaturallyAligned(&local_98,local_88);
    if (!bVar6) {
      pmVar8->is_uniform = false;
    }
    pmVar8->byte_size = AVar3;
    pmVar8->type = (Type)(uVar13 | uVar10);
    pmVar8->align = AVar4;
    EVar2 = (this_00->same_type).enum_;
    if ((EVar2 == (Enum)uVar10 || EVar2 == Any) &&
       (this_00->same_align == AVar4 || this_00->same_align == 0xffffffffffffffff)) {
      this_00->same_type = (Type)(uVar13 | uVar10);
      this_00->same_align = AVar4;
      (this_00->last_opc).enum_ = local_98.enum_;
    }
    else {
      (this_00->same_type).enum_ = Void;
      (this_00->same_type).type_index_ = 0xffffffff;
      this_00->same_align = 0xffffffffffffffff;
    }
  }
  if ((undefined1 *)local_78._0_8_ != local_78 + 0x10) {
    operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
  }
  return;
}

Assistant:

void LoadStore(uint64_t offset,
                 Opcode opc,
                 Type type,
                 Address align,
                 const Node& addr_exp) {
    auto byte_size = opc.GetMemorySize();
    type = GetMemoryType(type, opc);
    // We want to associate memory ops of a certain offset & size as being
    // relative to a uniquely identifiable pointer, such as a local.
    auto name = AddrExpName(addr_exp);
    if (name.empty()) {
      return;
    }
    auto& var = vars[name];
    auto& access = var.accesses[offset];
    // Check if previous access at this offset (if any) is of same size
    // and type (see Checklayouts below).
    if (access.byte_size && ((access.byte_size != byte_size) ||
                             (access.type != type) || (access.align != align)))
      access.is_uniform = false;
    // Also exclude weird alignment accesses from structs.
    if (!opc.IsNaturallyAligned(align))
      access.is_uniform = false;
    access.byte_size = byte_size;
    access.type = type;
    access.align = align;
    // Additionally, check if all accesses are to the same type, so
    // if layout check fails, we can at least declare it as pointer to
    // a type.
    if ((var.same_type == type || var.same_type == Type::Any) &&
        (var.same_align == align || var.same_align == kInvalidAddress)) {
      var.same_type = type;
      var.same_align = align;
      var.last_opc = opc;
    } else {
      var.same_type = Type::Void;
      var.same_align = kInvalidAddress;
    }
  }